

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

char * cJSON_SetValuestring(cJSON *object,char *valuestring)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  
  if ((object->type & 0x110U) == 0x10) {
    sVar1 = strlen(valuestring);
    pcVar3 = object->valuestring;
    sVar2 = strlen(pcVar3);
    if (sVar1 <= sVar2) {
      strcpy(pcVar3,valuestring);
      return object->valuestring;
    }
    if (valuestring != (char *)0x0) {
      sVar1 = strlen(valuestring);
      pcVar3 = (char *)(*global_hooks.allocate)(sVar1 + 1);
      if (pcVar3 != (char *)0x0) {
        memcpy(pcVar3,valuestring,sVar1 + 1);
        if (object->valuestring != (char *)0x0) {
          (*global_hooks.deallocate)(object->valuestring);
        }
        object->valuestring = pcVar3;
        return pcVar3;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

CJSON_PUBLIC(char*) cJSON_SetValuestring(cJSON *object, const char *valuestring)
{
    char *copy = NULL;
    /* if object's type is not cJSON_String or is cJSON_IsReference, it should not set valuestring */
    if (!(object->type & cJSON_String) || (object->type & cJSON_IsReference))
    {
        return NULL;
    }
    if (strlen(valuestring) <= strlen(object->valuestring))
    {
        strcpy(object->valuestring, valuestring);
        return object->valuestring;
    }
    copy = (char*) cJSON_strdup((const unsigned char*)valuestring, &global_hooks);
    if (copy == NULL)
    {
        return NULL;
    }
    if (object->valuestring != NULL)
    {
        cJSON_free(object->valuestring);
    }
    object->valuestring = copy;

    return copy;
}